

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

void __thiscall
TIFFImageHandler::SamplePlanarSeparateToContig
          (TIFFImageHandler *this,uchar *inBuffer,uchar *inSamplebuffer,tsize_t inSamplebuffersize)

{
  long lVar1;
  long local_40;
  tsize_t j;
  tsize_t i;
  tsize_t stride;
  tsize_t inSamplebuffersize_local;
  uchar *inSamplebuffer_local;
  uchar *inBuffer_local;
  TIFFImageHandler *this_local;
  
  lVar1 = inSamplebuffersize / (long)(ulong)this->mT2p->tiff_samplesperpixel;
  for (j = 0; j < lVar1; j = j + 1) {
    for (local_40 = 0; local_40 < (long)(ulong)this->mT2p->tiff_samplesperpixel;
        local_40 = local_40 + 1) {
      inBuffer[j * (ulong)this->mT2p->tiff_samplesperpixel + local_40] =
           inSamplebuffer[j + local_40 * lVar1];
    }
  }
  return;
}

Assistant:

void TIFFImageHandler::SamplePlanarSeparateToContig(unsigned char* inBuffer, 
													unsigned char* inSamplebuffer, 
													tsize_t inSamplebuffersize)
{
	tsize_t stride=0;
	tsize_t i=0;
	tsize_t j=0;
	
	stride=inSamplebuffersize/mT2p->tiff_samplesperpixel;
	for(i=0;i<stride;i++){
		for(j=0;j<mT2p->tiff_samplesperpixel;j++){
			inBuffer[i*mT2p->tiff_samplesperpixel + j] = inSamplebuffer[i + j*stride];
		}
	}
}